

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseStateVariable(Parser *this)

{
  ProgramImpl *pPVar1;
  Module *pMVar2;
  size_t sVar3;
  pointer pcVar4;
  size_type sVar5;
  pool_ref<soul::heart::Variable> *ppVar6;
  Identifier this_00;
  bool bVar7;
  bool bVar8;
  int iVar9;
  Variable *v;
  AggregateInitialiserList *pAVar10;
  long lVar11;
  char *pcVar12;
  char *message;
  Identifier *in_R9;
  bool bVar13;
  string_view newString;
  string_view other;
  Identifier name;
  FunctionParseState parseState;
  Type type;
  Identifier local_98;
  undefined1 local_90 [16];
  undefined1 auStack_80 [32];
  pointer ppStack_60;
  StructurePtr local_58;
  Identifier local_50;
  Type local_48;
  
  bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,"external");
  if (bVar7) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
  }
  readValueType(&local_48,this);
  pPVar1 = (this->program).pimpl;
  readVariableIdentifier_abi_cxx11_((string *)local_90,this);
  newString._M_str = (char *)local_90._0_8_;
  newString._M_len = local_90._8_8_;
  local_98 = Identifier::Pool::get(&(pPVar1->allocator).identifiers,newString);
  if ((Function *)local_90._0_8_ != (Function *)auStack_80) {
    operator_delete((void *)local_90._0_8_,auStack_80._0_8_ + 1);
  }
  pMVar2 = (this->module).object;
  if (pMVar2 == (Module *)0x0) {
    iVar9 = 0x3c;
    pcVar12 = "operator->";
    message = "object != nullptr";
  }
  else {
    if (local_98.name != (string *)0x0) {
      sVar3 = (pMVar2->stateVariables).stateVariables.numActive;
      bVar13 = sVar3 == 0;
      local_50.name = (string *)this;
      if (!bVar13) {
        pcVar4 = ((local_98.name)->_M_dataplus)._M_p;
        sVar5 = (local_98.name)->_M_string_length;
        ppVar6 = (pMVar2->stateVariables).stateVariables.items;
        lVar11 = 0;
        do {
          other._M_str = pcVar4;
          other._M_len = sVar5;
          bVar8 = Identifier::operator==
                            ((Identifier *)(*(long *)((long)&ppVar6->object + lVar11) + 0x30),other)
          ;
          if (bVar8) {
            if (!bVar13) {
              lVar11 = *(long *)((long)&ppVar6->object + lVar11);
              goto LAB_00253059;
            }
            break;
          }
          lVar11 = lVar11 + 8;
          bVar13 = sVar3 << 3 == lVar11;
        } while (!bVar13);
      }
      lVar11 = 0;
LAB_00253059:
      this_00.name = local_50.name;
      if (lVar11 != 0) {
        CompileMessageHelpers::createMessage<soul::Identifier&>
                  ((CompileMessage *)local_90,(CompileMessageHelpers *)0x1,none,0x2ab445,
                   (char *)&local_98,in_R9);
        (*((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            *)&(this_00.name)->_M_dataplus)->_vptr_Tokeniser[2])(this_00.name,local_90);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)auStack_80._16_8_);
        if ((Function *)local_90._0_8_ != (Function *)auStack_80) {
          operator_delete((void *)local_90._0_8_,auStack_80._0_8_ + 1);
        }
      }
      if (this_00.name[4]._M_string_length != 0) {
        local_90._0_4_ = (uint)bVar7 << 2;
        v = PoolAllocator::
            allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                      (*(PoolAllocator **)(this_00.name[4]._M_string_length + 0x128),
                       (CodeLocation *)((long)&(this_00.name)->field_2 + 8),&local_48,&local_98,
                       (Role *)local_90);
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            *)this_00.name,(TokenType)0x289d51);
        if (bVar7) {
          if (this_00.name[4]._M_string_length == 0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          local_90._0_8_ =
               PoolAllocator::allocate<soul::heart::Function>
                         (*(PoolAllocator **)(this_00.name[4]._M_string_length + 0x128));
          local_90._8_8_ = (pointer)0x0;
          auStack_80._0_8_ = 0;
          auStack_80._8_8_ = 0;
          auStack_80._16_8_ = (SourceCodeText *)0x0;
          auStack_80._24_8_ = (char *)0x0;
          ppStack_60 = (pointer)0x0;
          local_58.object = (Structure *)0x0;
          pcVar12 = (char *)this_00.name[1]._M_string_length;
          if ((pcVar12 == "(") ||
             ((pcVar12 != (char *)0x0 && (iVar9 = strcmp(pcVar12,"("), iVar9 == 0)))) {
            pAVar10 = parseInitialiserList
                                ((Parser *)this_00.name,(FunctionParseState *)local_90,&local_48);
          }
          else {
            pAVar10 = (AggregateInitialiserList *)
                      parseExpression((Parser *)this_00.name,(FunctionParseState *)local_90);
          }
          (v->initialValue).object = &pAVar10->super_Expression;
          if ((SourceCodeText *)auStack_80._16_8_ != (SourceCodeText *)0x0) {
            operator_delete((void *)auStack_80._16_8_,(long)ppStack_60 - auStack_80._16_8_);
          }
          if ((pointer)local_90._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_90._8_8_,auStack_80._8_8_ - local_90._8_8_);
          }
        }
        parseAnnotation((Parser *)this_00.name,&v->annotation);
        if (this_00.name[4]._M_string_length != 0) {
          Module::StateVariables::add
                    ((StateVariables *)(this_00.name[4]._M_string_length + 0x250),v);
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      *)this_00.name,(TokenType)0x2881d4);
          RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
          return;
        }
      }
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    iVar9 = 0x22;
    pcVar12 = "operator basic_string_view";
    message = "isValid()";
  }
  throwInternalCompilerError(message,pcVar12,iVar9);
}

Assistant:

void parseStateVariable()
    {
        bool isExternal = matchIf ("external");
        auto type = readValueType();
        auto name = program.getAllocator().get (readVariableIdentifier());

        if (module->stateVariables.find (name))
            throwError (Errors::nameInUse (name));

        auto& v = module->allocate<heart::Variable> (location, type, name,
                                                     isExternal ? heart::Variable::Role::external
                                                                : heart::Variable::Role::state);

        if (matchIf (HEARTOperator::assign))
        {
            FunctionParseState parseState (module->allocate<heart::Function>());

            if (matches (HEARTOperator::openParen))
                v.initialValue = parseInitialiserList (parseState, type);
            else
                v.initialValue = parseExpression (parseState);
        }

        parseAnnotation (v.annotation);

        module->stateVariables.add (v);
        expectSemicolon();
    }